

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPDiscreteStatistics.cpp
# Opt level: O1

size_t __thiscall
MADPDiscreteStatistics::ComputeEstimatedSizeForCachingJointBeliefs(MADPDiscreteStatistics *this)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  long lVar3;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar4 [16];
  undefined1 extraout_var [56];
  undefined1 auVar5 [64];
  
  sVar2 = ComputeNrJointActionObservationHistories(this);
  lVar3 = (**(code **)((long)*this->_m_madp + 0x30))();
  auVar5._8_56_ = extraout_var;
  auVar5._0_8_ = extraout_XMM0_Qa;
  auVar1 = vcvtusi2sd_avx512f(auVar5._0_16_,lVar3 * sVar2 * 0x40);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = auVar1._0_8_ * 1.1920928955078125e-07;
  sVar2 = vcvttsd2usi_avx512f(auVar4);
  return sVar2;
}

Assistant:

size_t MADPDiscreteStatistics::ComputeEstimatedSizeForCachingJointBeliefs()
{

    size_t doubleSizeInChars = sizeof(double);
    size_t doubleSizeInBits = doubleSizeInChars * CHAR_BIT;

    //the number of joint beliefs that would have to be cached
    size_t nrJBs = ComputeNrJointActionObservationHistories();
    //the size of those joint beliefs:
    size_t JBSize = _m_madp->GetNrStates();

    size_t JBCacheSizeInBits = nrJBs* JBSize * doubleSizeInBits;
    size_t JBCacheSizeInMB = (double) JBCacheSizeInBits / (8 * 1024 * 1024);
    return JBCacheSizeInMB;

}